

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmShiftIm<(moira::Instr)13,(moira::Mode)11,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  StrWriter *pSVar3;
  Imd im;
  
  im.raw = 8;
  if ((op & 0xe00) != 0) {
    im.raw = op >> 9 & 7;
  }
  pSVar3 = StrWriter::operator<<(str);
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar3,im);
  StrWriter::operator<<(pSVar3,", ");
  pcVar1 = pSVar3->ptr;
  pSVar3->ptr = pcVar1 + 1;
  *pcVar1 = 'D';
  pbVar2 = (byte *)pSVar3->ptr;
  pSVar3->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)op & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmShiftIm(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd ( ____xxx_________(op) );
    auto dst = Dn  ( _____________xxx(op) );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}